

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void detail::
     serialize_helper<std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
     ::apply(vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             *obj,iterator *res)

{
  pointer pvVar1;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *cur;
  pointer obj_00;
  
  *(long *)res->_M_current =
       ((long)(obj->
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(obj->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  res->_M_current = res->_M_current + 8;
  pvVar1 = (obj->
           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (obj_00 = (obj->
                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; obj_00 != pvVar1; obj_00 = obj_00 + 1) {
    serialize_helper<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::apply(obj_00,res);
  }
  return;
}

Assistant:

static void apply(const std::vector<T>& obj, StreamType::iterator& res)
        {
            // store the number of elements of this vector at the beginning
            serializer(obj.size(), res);
            for (const auto& cur : obj)
            {
                serializer(cur, res);
            }
        }